

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O0

json_string *
JSONWorker::FixString(json_string *__return_storage_ptr__,json_string *value_t,bool *flag)

{
  long lVar1;
  long lVar2;
  char *local_48;
  char *p;
  char *end;
  undefined1 local_21;
  bool *local_20;
  bool *flag_local;
  json_string *value_t_local;
  json_string *res;
  
  *flag = false;
  local_21 = 0;
  local_20 = flag;
  flag_local = (bool *)value_t;
  value_t_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::length();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  lVar1 = std::__cxx11::string::data();
  lVar2 = std::__cxx11::string::length();
  p = (char *)(lVar1 + lVar2);
  for (local_48 = (char *)std::__cxx11::string::data(); local_48 != p; local_48 = local_48 + 1) {
    if (*local_48 == '\\') {
      *local_20 = true;
      local_48 = local_48 + 1;
      SpecialChar(&local_48,p,__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*local_48);
    }
  }
  shrinkString(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

json_string JSONWorker::FixString(const json_string & value_t, bool & flag) json_nothrow {
    #define setflag(x) flag = x
#endif

    //Do things like unescaping
    setflag(false);
    json_string res;
    res.reserve(value_t.length());	 //since it goes one character at a time, want to reserve it first so that it doens't have to reallocating
	const json_char * const end = value_t.data() + value_t.length();
    for(const json_char * p = value_t.data(); p != end; ++p){
	   switch (*p){
		  case JSON_TEXT('\\'):
			 setflag(true);
			 SpecialChar(++p, end, res);
			 break;
		  default:
			 res += *p;
			 break;
	   }
    }
	shrinkString(res);  //because this is actually setting something to be stored, shrink it it need be
	return res;
}